

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

StringPtr kj::consumeLine(char **ptr)

{
  char cVar1;
  char *pcVar2;
  char *begin;
  char *pcVar3;
  char *end_1;
  char *end;
  char *p;
  char *start;
  char **ptr_local;
  
  begin = skipSpace(*ptr);
  end = begin;
  while( true ) {
    while( true ) {
      while( true ) {
        pcVar3 = end;
        cVar1 = *end;
        if (cVar1 == '\0') {
          *ptr = end;
          StringPtr::StringPtr((StringPtr *)&ptr_local,begin,end);
          return (StringPtr)_ptr_local;
        }
        if (cVar1 != '\n') break;
        pcVar3 = end + 1;
        if ((*pcVar3 != ' ') && (*pcVar3 != '\t')) {
          *ptr = pcVar3;
          *end = '\0';
          StringPtr::StringPtr((StringPtr *)&ptr_local,begin,end);
          return (StringPtr)_ptr_local;
        }
        *end = ' ';
        end = pcVar3;
      }
      if (cVar1 == '\r') break;
      end = end + 1;
    }
    pcVar2 = end + 1;
    if (end[1] == '\n') {
      pcVar2 = end + 2;
    }
    end = pcVar2;
    if ((*end != ' ') && (*end != '\t')) break;
    *pcVar3 = ' ';
    end[-1] = ' ';
  }
  *ptr = end;
  *pcVar3 = '\0';
  StringPtr::StringPtr((StringPtr *)&ptr_local,begin,pcVar3);
  return (StringPtr)_ptr_local;
}

Assistant:

static kj::StringPtr consumeLine(char*& ptr) {
  char* start = skipSpace(ptr);
  char* p = start;

  for (;;) {
    switch (*p) {
      case '\0':
        ptr = p;
        return kj::StringPtr(start, p);

      case '\r': {
        char* end = p++;
        if (*p == '\n') ++p;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \r\n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          p[-1] = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      case '\n': {
        char* end = p++;

        if (*p == ' ' || *p == '\t') {
          // Whoa, continuation line. These are deprecated, but historically a line starting with
          // a space was treated as a continuation of the previous line. The behavior should be
          // the same as if the \n were replaced with spaces, so let's do that here to prevent
          // confusion later.
          *end = ' ';
          break;
        }

        ptr = p;
        *end = '\0';
        return kj::StringPtr(start, end);
      }

      default:
        ++p;
        break;
    }
  }
}